

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O0

void __thiscall
cmServerProtocol1::GeneratorInformation::GeneratorInformation
          (GeneratorInformation *this,string *generatorName,string *extraGeneratorName,
          string *toolset,string *platform,string *sourceDirectory,string *buildDirectory)

{
  string *sourceDirectory_local;
  string *platform_local;
  string *toolset_local;
  string *extraGeneratorName_local;
  string *generatorName_local;
  GeneratorInformation *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)generatorName);
  std::__cxx11::string::string((string *)&this->ExtraGeneratorName,(string *)extraGeneratorName);
  std::__cxx11::string::string((string *)&this->Toolset,(string *)toolset);
  std::__cxx11::string::string((string *)&this->Platform,(string *)platform);
  std::__cxx11::string::string((string *)&this->SourceDirectory,(string *)sourceDirectory);
  std::__cxx11::string::string((string *)&this->BuildDirectory,(string *)buildDirectory);
  return;
}

Assistant:

cmServerProtocol1::GeneratorInformation::GeneratorInformation(
  const std::string& generatorName, const std::string& extraGeneratorName,
  const std::string& toolset, const std::string& platform,
  const std::string& sourceDirectory, const std::string& buildDirectory)
  : GeneratorName(generatorName)
  , ExtraGeneratorName(extraGeneratorName)
  , Toolset(toolset)
  , Platform(platform)
  , SourceDirectory(sourceDirectory)
  , BuildDirectory(buildDirectory)
{
}